

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O2

uint64_t hashmap_sip(void *data,size_t len,uint64_t seed0,uint64_t seed1)

{
  ulong uVar1;
  uint64_t k1;
  ulong uVar2;
  uint64_t k0;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = seed1 ^ 0x7465646279746573;
  uVar5 = seed0 ^ 0x6c7967656e657261;
  uVar6 = seed1 ^ 0x646f72616e646f6d;
  uVar1 = seed0 ^ 0x736f6d6570736575;
  puVar3 = (ulong *)data;
  for (uVar2 = len & 0xfffffffffffffff8; uVar2 != 0; uVar2 = uVar2 - 8) {
    uVar1 = uVar1 + uVar6;
    uVar7 = (uVar6 << 0xd | uVar6 >> 0x33) ^ uVar1;
    uVar4 = uVar4 ^ *puVar3;
    uVar6 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5 + uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar6;
    uVar5 = uVar5 + uVar4 + uVar7;
    uVar7 = (uVar7 << 0x11 | uVar7 >> 0x2f) ^ uVar5;
    uVar4 = (uVar6 << 0x15 | uVar6 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar7;
    uVar6 = (uVar7 << 0xd | uVar7 >> 0x33) ^ uVar1;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar6;
    uVar6 = (uVar6 << 0x11 | uVar6 >> 0x2f) ^ uVar5;
    uVar5 = uVar5 << 0x20 | uVar5 >> 0x20;
    uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 ^ *puVar3;
    puVar3 = puVar3 + 1;
  }
  uVar2 = len & 0xfffffffffffffff8;
  uVar7 = len << 0x38;
  switch((uint)len & 7) {
  case 7:
    uVar7 = uVar7 | (ulong)*(byte *)((long)data + uVar2 + 6) << 0x30;
  case 6:
    uVar7 = uVar7 | (ulong)*(byte *)((long)data + uVar2 + 5) << 0x28;
  case 5:
    uVar7 = uVar7 | (ulong)*(byte *)((long)data + uVar2 + 4) << 0x20;
  case 4:
    uVar7 = uVar7 | (ulong)*(byte *)((long)data + uVar2 + 3) << 0x18;
  case 3:
    uVar7 = uVar7 | (ulong)*(byte *)((long)data + uVar2 + 2) << 0x10;
  case 2:
    uVar7 = uVar7 | (ulong)*(byte *)((long)data + uVar2 + 1) << 8;
  case 1:
    uVar7 = uVar7 | *(byte *)((long)data + uVar2);
  case 0:
    uVar1 = uVar1 + uVar6;
    uVar6 = (uVar6 << 0xd | uVar6 >> 0x33) ^ uVar1;
    uVar4 = uVar4 ^ uVar7;
    uVar2 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar5 + uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar4 = uVar5 + uVar4 + uVar6;
    uVar5 = (uVar6 << 0x11 | uVar6 >> 0x2f) ^ uVar4;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar4 = uVar4 + uVar5;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar1 = (uVar1 ^ uVar7) + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar4 = ((uVar4 << 0x20 | uVar4 >> 0x20) ^ 0xff) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar4 = uVar4 + uVar5;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar4 = uVar4 + uVar5;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar2;
    uVar4 = uVar4 + uVar5;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar2;
    uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar4;
    uVar1 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1 + uVar5;
    uVar4 = uVar4 + uVar1;
    return (uVar4 << 0x20 | uVar4 >> 0x20) ^ (uVar1 << 0x11 | uVar1 >> 0x2f) ^
           (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar4;
  }
}

Assistant:

uint64_t hashmap_sip(const void *data, size_t len, uint64_t seed0,
    uint64_t seed1)
{
    return SIP64((uint8_t*)data, len, seed0, seed1);
}